

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryTransfer
          (InMemoryDirectory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode)

{
  Impl *pIVar1;
  size_t sVar2;
  InMemoryFileFactory *pIVar3;
  undefined8 *puVar4;
  undefined1 uVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  String *pSVar10;
  bool bVar11;
  Own<const_kj::Directory,_std::nullptr_t> OVar12;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  Fault f;
  anon_union_32_1_a8a2e026_for_OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>_2
  local_c8;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_8f;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  newNode;
  
  sVar8 = toPath.parts.size_;
  pSVar10 = toPath.parts.ptr;
  if (sVar8 == 1) {
    if ((toMode & MODIFY) == 0) {
      f.exception._0_4_ = (uint)f.exception & 0xffffff00;
      _::Mutex::lock(&(this->impl).mutex,1);
      if ((pSVar10->content).size_ == 0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (pSVar10->content).ptr;
      }
      name_00.content.size_ = (size_t)pcVar9;
      name_00.content.ptr = (char *)&(this->impl).value;
      Impl::tryGetEntry((Impl *)&f,name_00);
      lVar7 = CONCAT44(f.exception._4_4_,(uint)f.exception);
      _::Mutex::unlock(&(this->impl).mutex,SHARED,(Waiter *)0x0);
      if (lVar7 != 0) goto LAB_001e5812;
    }
    newNode.tag = 0;
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
              (&f,fromDirectory,CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_));
    if (f.exception._0_1_ == true) {
      if (local_c8._0_4_ == 0) {
        (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
                  (&f,fromDirectory,CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_),
                   CONCAT44(fromPath.parts.size_._4_4_,(undefined4)fromPath.parts.size_),2);
        if ((_func_int **)local_c8._0_8_ == (_func_int **)0x0) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x516,FAILED,
                     "fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY) != nullptr",
                     "\"source node deleted concurrently during transfer\", fromPath",
                     (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
          _::Debug::Fault::fatal(&f);
        }
        puVar4 = (undefined8 *)CONCAT44(f.exception._4_4_,(uint)f.exception);
        if (mode == COPY) {
          pIVar3 = (this->impl).value.fileFactory;
          (*(code *)**(undefined8 **)pIVar3)(&f,pIVar3,(this->impl).value.clock);
          (**(code **)(*(_func_int **)local_c8._0_8_ + 0x68))
                    (local_c8._0_8_,0,local_c8._0_8_,0,local_c8._8_8_);
          (**(code **)*puVar4)
                    (puVar4,local_c8._0_8_ + *(long *)(*(_func_int **)local_c8._0_8_ + -0x10));
        }
        f.exception._0_4_ = 1;
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                              *)&f);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                   *)&f);
      }
      else if (local_c8._0_4_ == 1) {
        (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
                  (&f,fromDirectory,CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_),
                   CONCAT44(fromPath.parts.size_._4_4_,(undefined4)fromPath.parts.size_),2);
        if ((_func_int **)local_c8._0_8_ == (_func_int **)0x0) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x524,FAILED,
                     "fromDirectory.tryOpenSubdir(fromPath, WriteMode::MODIFY) != nullptr",
                     "\"source node deleted concurrently during transfer\", fromPath",
                     (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
          _::Debug::Fault::fatal(&f);
        }
        puVar4 = (undefined8 *)CONCAT44(f.exception._4_4_,(uint)f.exception);
        if (mode == MOVE) {
          if ((fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode !=
              (_func_int **)&PTR_getFd_00261f50) {
            OVar12 = Impl::copyDirectory((Impl *)&f,(Directory *)&(this->impl).value,
                                         SUB81(local_c8._0_8_,0));
            (**(code **)*puVar4)
                      (puVar4,local_c8._0_8_ + *(long *)(*(_func_int **)local_c8._0_8_ + -0x10),
                       OVar12.ptr);
          }
        }
        else if (mode == COPY) {
          OVar12 = Impl::copyDirectory((Impl *)&f,(Directory *)&(this->impl).value,
                                       SUB81(local_c8._0_8_,0));
          (**(code **)*puVar4)
                    (puVar4,local_c8._0_8_ + *(long *)(*(_func_int **)local_c8._0_8_ + -0x10),
                     OVar12.ptr);
        }
        f.exception._0_4_ = 2;
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                              *)&f);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                   *)&f);
      }
      else {
        if (local_c8._0_4_ != 2) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],kj::PathPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x54f,FAILED,(char *)0x0,
                     "\"InMemoryDirectory can\'t link an inode of this type\", fromPath",
                     (char (*) [51])"InMemoryDirectory can\'t link an inode of this type",&fromPath)
          ;
          _::Debug::Fault::fatal(&f);
        }
        (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xc])
                  (&_kjCondition,fromDirectory,
                   CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_));
        f.exception._0_1_ = _kjCondition.value;
        if (_kjCondition.value == false) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x549,FAILED,"fromDirectory.tryReadlink(fromPath) != nullptr",
                     "\"source node deleted concurrently during transfer\", fromPath",
                     (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
          _::Debug::Fault::fatal((Fault *)&_kjCondition);
        }
        __kjCondition = (Exception *)local_c8._24_8_;
        f.exception._0_4_ = 3;
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=(&newNode,(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                              *)&f);
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                   *)&f);
      }
      if (mode == MOVE) {
        iVar6 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                          (fromDirectory,CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_)
                           ,CONCAT44(fromPath.parts.size_._4_4_,(undefined4)fromPath.parts.size_));
        _kjCondition.value = (bool)(char)iVar6;
        if ((char)iVar6 == '\0') {
          _::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[19],kj::PathPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x553,FAILED,"fromDirectory.tryRemove(fromPath)",
                     "_kjCondition,\"couldn\'t move node\", fromPath",&_kjCondition,
                     (char (*) [19])"couldn\'t move node",&fromPath);
          _::Debug::Fault::fatal(&f);
        }
      }
      f.exception._0_4_ = (uint)f.exception & 0xffffff00;
      _::Mutex::lock(&(this->impl).mutex,0);
      pIVar1 = &(this->impl).value;
      sVar8 = (pSVar10->content).size_;
      if (sVar8 == 0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (pSVar10->content).ptr;
      }
      name_01.content.size_ = (size_t)pcVar9;
      name_01.content.ptr = (char *)pIVar1;
      Impl::openEntry((Impl *)&f,name_01,(int)sVar8 + (uint)(sVar8 == 0));
      bVar11 = CONCAT44(f.exception._4_4_,(uint)f.exception) != 0;
      if (bVar11) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                     *)(CONCAT44(f.exception._4_4_,(uint)f.exception) + 0x18),&newNode);
        lVar7 = (*(code *)**(undefined8 **)pIVar1->clock)();
        (this->impl).value.lastModified.value.value = lVar7;
      }
      _::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
    }
    else {
      bVar11 = false;
    }
    OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
    ::destroy(&newNode);
  }
  else {
    if (sVar8 == 0) {
      if ((toMode & CREATE) == 0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x4fe,FAILED,(char *)0x0,"\"can\'t replace self\"",
                   (char (*) [19])"can\'t replace self");
        _::Debug::Fault::~Fault(&f);
        return false;
      }
    }
    else {
      sVar2 = (pSVar10->content).size_;
      if (sVar2 == 0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (pSVar10->content).ptr;
      }
      name.content.size_ = (size_t)pcVar9;
      name.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)&f,name,(int)sVar2 + (uint)(sVar2 == 0));
      if ((_func_int **)local_c8._0_8_ != (_func_int **)0x0) {
        uVar5 = (**(code **)(*(_func_int **)local_c8._0_8_ + 0xa0))
                          (local_c8._0_8_,pSVar10 + 1,sVar8 - 1,toMode,fromDirectory,mode,
                           CONCAT44(fromPath.parts.ptr._4_4_,fromPath.parts.ptr._0_4_),
                           CONCAT44(fromPath.parts.size_._4_4_,(undefined4)fromPath.parts.size_));
        (*(code *)**(undefined8 **)CONCAT44(f.exception._4_4_,(uint)f.exception))
                  ((undefined8 *)CONCAT44(f.exception._4_4_,(uint)f.exception),
                   local_c8._0_8_ + *(long *)(*(_func_int **)local_c8._0_8_ + -0x10));
        return (bool)uVar5;
      }
    }
LAB_001e5812:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode) const override {
    if (toPath.size() == 0) {
      if (has(toMode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (toPath.size() == 1) {
      if (!has(toMode, WriteMode::MODIFY)) {
        // Replacement is not allowed, so we'll have to check upfront if the target path exists.
        // Unfortunately we have to take a lock and then drop it immediately since we can't keep
        // the lock held while accessing `fromDirectory`.
        if (impl.lockShared()->tryGetEntry(toPath[0]) != kj::none) {
          return false;
        }
      }

      OneOf<FileNode, DirectoryNode, SymlinkNode> newNode;
      FsNode::Metadata meta;
      KJ_IF_SOME(m, fromDirectory.tryLstat(fromPath)) {
        meta = m;
      } else {
        return false;
      }

      switch (meta.type) {
        case FsNode::Type::FILE: {
          auto file = KJ_ASSERT_NONNULL(
              fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY),
              "source node deleted concurrently during transfer", fromPath);

          if (mode == TransferMode::COPY) {
            auto copy = impl.getWithoutLock().newFile();
            copy->copy(0, *file, 0, meta.size);
            file = kj::mv(copy);
          }

          newNode = FileNode { kj::mv(file) };
          break;
        }
        case FsNode::Type::DIRECTORY: {
          auto subdir = KJ_ASSERT_NONNULL(
              fromDirectory.tryOpenSubdir(fromPath, WriteMode::MODIFY),
              "source node deleted concurrently during transfer", fromPath);

          switch (mode) {
            case TransferMode::COPY:
              // Copying is straightforward: Make a deep copy of the entire directory tree,
              // including file contents.
              subdir = impl.getWithoutLock().copyDirectory(*subdir, /* copyFiles = */ true);
              break;

            case TransferMode::LINK:
              // To "link", we can safely just place `subdir` directly into our own tree.
              break;

            case TransferMode::MOVE:
              // Moving may be tricky:
              //
              // If `fromDirectory` is an `InMemoryDirectory`, then we know that removing the
              // subdir just unlinks the object without modifying it, so we can safely just link it
              // into our own tree.
              //
              // However, if `fromDirectory` is a disk directory, then removing the subdir will
              // likely perform a recursive delete, thus leaving `subdir` pointing to an empty
              // directory. If we link that into our tree, it's useless. So, instead, perform a
              // deep copy of the directory tree upfront, into an InMemoryDirectory. However, file
              // content need not be copied, since unlinked files keep their contents until closed.
              if (kj::dynamicDowncastIfAvailable<const InMemoryDirectory>(fromDirectory) ==
                  kj::none) {
                subdir = impl.getWithoutLock().copyDirectory(*subdir, /* copyFiles = */ false);
              }
              break;
          }

          newNode = DirectoryNode { kj::mv(subdir) };
          break;
        }
        case FsNode::Type::SYMLINK: {
          auto link = KJ_ASSERT_NONNULL(fromDirectory.tryReadlink(fromPath),
              "source node deleted concurrently during transfer", fromPath);

          newNode = SymlinkNode {meta.lastModified, kj::mv(link)};
          break;
        }
        default:
          KJ_FAIL_REQUIRE("InMemoryDirectory can't link an inode of this type", fromPath);
      }

      if (mode == TransferMode::MOVE) {
        KJ_ASSERT(fromDirectory.tryRemove(fromPath), "couldn't move node", fromPath);
      }

      // Take the lock to insert the entry into our map. Remember that it's important we do not
      // manipulate `fromDirectory` while the lock is held, since it could be the same directory.
      {
        auto lock = impl.lockExclusive();
        KJ_IF_SOME(targetEntry, lock->openEntry(toPath[0], toMode)) {
          targetEntry.init(kj::mv(newNode));;
        } else {
          return false;
        }
        lock->modified();
      }

      return true;
    } else {
      // TODO(someday): Ideally we wouldn't create parent directories if fromPath doesn't exist.
      //   This requires a different approach to the code here, though.
      KJ_IF_SOME(child, tryGetParent(toPath[0], toMode)) {
        return child->tryTransfer(
            toPath.slice(1, toPath.size()), toMode, fromDirectory, fromPath, mode);
      } else {
        return false;
      }
    }
  }